

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

RepeatedField<long> *
google::protobuf::Arena::CreateArenaCompatible<google::protobuf::RepeatedField<long>>(Arena *arena)

{
  void *ptr;
  RepeatedField<long> *this;
  Arena *local_18;
  
  if (arena == (Arena *)0x0) {
    this = (RepeatedField<long> *)operator_new(0x10);
    RepeatedField<long>::RepeatedField(this,(Arena *)0x0);
  }
  else {
    ptr = Allocate(arena,0x10);
    local_18 = arena;
    this = InternalHelper<google::protobuf::RepeatedField<long>>::
           Construct<google::protobuf::Arena*>(ptr,&local_18);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateArenaCompatible(Arena* arena) {
    static_assert(is_arena_constructable<T>::value,
                  "Can only construct types that are ArenaConstructable");
    if (PROTOBUF_PREDICT_FALSE(arena == nullptr)) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }